

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O2

void __thiscall
checkqueue_tests::test_CheckQueue_Recovers_From_Failure::test_method
          (test_CheckQueue_Recovers_From_Failure *this)

{
  FakeCheckCheckCompletion FVar1;
  FakeCheckCheckCompletion FVar2;
  long lVar3;
  iterator in_R8;
  iterator in_R9;
  int iVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  check_type cVar5;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  assertion_result local_90;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  __single_object fail_queue;
  CCheckQueueControl<FailingCheck> control;
  undefined2 local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<CCheckQueue<FailingCheck>,unsigned_int_const&,int_const&>
            ((uint *)&fail_queue,(int *)&QUEUE_BATCH_SIZE);
  for (iVar4 = 0; iVar4 != 10; iVar4 = iVar4 + 1) {
    local_3a = 1;
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      FVar1 = *(FakeCheckCheckCompletion *)((long)&local_3a + lVar3);
      CCheckQueueControl<FailingCheck>::CCheckQueueControl
                (&control,(CCheckQueue<FakeCheckCheckCompletion> *)
                          fail_queue._M_t.
                          super___uniq_ptr_impl<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_CCheckQueue<FailingCheck>_*,_std::default_delete<CCheckQueue<FailingCheck>_>_>
                          .super__Head_base<0UL,_CCheckQueue<FailingCheck>_*,_false>._M_head_impl);
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x0;
      std::vector<FailingCheck,_std::allocator<FailingCheck>_>::resize
                ((vector<FailingCheck,_std::allocator<FailingCheck>_> *)&vChecks,100,
                 (value_type *)&local_90);
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_start[99] = FVar1;
      CCheckQueueControl<FailingCheck>::Add(&control,&vChecks);
      std::_Vector_base<FailingCheck,_std::allocator<FailingCheck>_>::~_Vector_base
                ((_Vector_base<FailingCheck,_std::allocator<FailingCheck>_> *)&vChecks);
      FVar2 = (FakeCheckCheckCompletion)CCheckQueueControl<FailingCheck>::Wait(&control);
      local_68 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_60 = "";
      local_78 = &boost::unit_test::basic_cstring<char_const>::null;
      local_70 = &boost::unit_test::basic_cstring<char_const>::null;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      file.m_end = (iterator)0x103;
      file.m_begin = (iterator)&local_68;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_78,msg);
      local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(FVar1 != FVar2);
      local_90.m_message.px = (element_type *)0x0;
      local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_c8 = "r != end_fails";
      local_c0 = "";
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)vChecks.
                            super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_0113a070;
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)boost::unit_test::lazy_ostream::inst;
      local_d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
      ;
      local_d0 = "";
      in_R8 = (iterator)0x2;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_90,(lazy_ostream *)&vChecks,2,0,WARN,_cVar5,(size_t)&local_d8,0x103);
      boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
      CCheckQueueControl<FailingCheck>::~CCheckQueueControl(&control);
    }
  }
  std::unique_ptr<CCheckQueue<FailingCheck>,_std::default_delete<CCheckQueue<FailingCheck>_>_>::
  ~unique_ptr(&fail_queue);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_Recovers_From_Failure)
{
    auto fail_queue = std::make_unique<Failing_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    for (auto times = 0; times < 10; ++times) {
        for (const bool end_fails : {true, false}) {
            CCheckQueueControl<FailingCheck> control(fail_queue.get());
            {
                std::vector<FailingCheck> vChecks;
                vChecks.resize(100, false);
                vChecks[99] = end_fails;
                control.Add(std::move(vChecks));
            }
            bool r =control.Wait();
            BOOST_REQUIRE(r != end_fails);
        }
    }
}